

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

void __thiscall
icu_63::ArgExtractor::ArgExtractor
          (ArgExtractor *this,NumberFormat *param_1,Formattable *obj,UErrorCode *param_3)

{
  UObject *pUVar1;
  char16_t *src;
  Formattable *pFVar2;
  Measure *local_50;
  CurrencyAmount *amt;
  UObject *o;
  UErrorCode *param_3_local;
  Formattable *obj_local;
  NumberFormat *param_1_local;
  ArgExtractor *this_local;
  
  this->num = obj;
  this->fWasCurrency = '\0';
  pUVar1 = Formattable::getObject(obj);
  if (pUVar1 != (UObject *)0x0) {
    if (pUVar1 == (UObject *)0x0) {
      local_50 = (Measure *)0x0;
    }
    else {
      local_50 = (Measure *)__dynamic_cast(pUVar1,&UObject::typeinfo,&CurrencyAmount::typeinfo,0);
    }
    if (local_50 != (Measure *)0x0) {
      src = CurrencyAmount::getISOCurrency((CurrencyAmount *)local_50);
      u_strcpy_63(this->save,src);
      pFVar2 = Measure::getNumber(local_50);
      this->num = pFVar2;
      this->fWasCurrency = '\x01';
      return;
    }
  }
  this->save[0] = L'\0';
  return;
}

Assistant:

ArgExtractor::ArgExtractor(const NumberFormat& /*nf*/, const Formattable& obj, UErrorCode& /*status*/)
  : num(&obj), fWasCurrency(FALSE) {

    const UObject* o = obj.getObject(); // most commonly o==NULL
    const CurrencyAmount* amt;
    if (o != NULL && (amt = dynamic_cast<const CurrencyAmount*>(o)) != NULL) {
        // getISOCurrency() returns a pointer to internal storage, so we
        // copy it to retain it across the call to setCurrency().
        //const UChar* curr = amt->getISOCurrency();
        u_strcpy(save, amt->getISOCurrency());
        num = &amt->getNumber();
        fWasCurrency=TRUE;
    } else {
      save[0]=0;
    }
}